

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

RequiredError *
CLI::RequiredError::Option
          (RequiredError *__return_storage_ptr__,size_t min_option,size_t max_option,size_t used,
          string *option_list)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  long *plVar4;
  undefined8 *puVar5;
  size_type *psVar6;
  ulong *puVar7;
  long *plVar8;
  size_t sVar9;
  char cVar10;
  ulong uVar11;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  ulong *local_190;
  uint local_188;
  undefined4 uStack_184;
  ulong local_180 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  uint local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar3 = min_option ^ 1;
  if (((max_option ^ 1) == 0 && uVar3 == 0) && used == 0) {
    ::std::operator+(&local_1d0,"Exactly 1 option from [",option_list);
    plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_50.field_2._M_allocated_capacity = *psVar6;
      local_50.field_2._8_8_ = plVar4[3];
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    }
    else {
      local_50.field_2._M_allocated_capacity = *psVar6;
      local_50._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_50._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    RequiredError(__return_storage_ptr__,&local_50);
    uVar12 = local_50.field_2._M_allocated_capacity;
    _Var13._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00129f56:
      operator_delete(_Var13._M_p,uVar12 + 1);
    }
LAB_00129f5e:
    local_120._M_allocated_capacity = local_1d0.field_2._M_allocated_capacity;
    _Var13._M_p = local_1d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p == &local_1d0.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_0012ab5d;
  }
  if (((max_option ^ 1) != 0 || uVar3 != 0) || used < 2) {
    if (uVar3 == 0 && used == 0) {
      ::std::operator+(&local_1d0,"At least 1 option from [",option_list);
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_90.field_2._M_allocated_capacity = *psVar6;
        local_90.field_2._8_8_ = plVar4[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar6;
        local_90._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_90._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      RequiredError(__return_storage_ptr__,&local_90);
      uVar12 = local_90.field_2._M_allocated_capacity;
      _Var13._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) goto LAB_00129f56;
      goto LAB_00129f5e;
    }
    if (used < min_option) {
      cVar10 = '\x01';
      if (9 < min_option) {
        sVar9 = min_option;
        cVar2 = '\x04';
        do {
          cVar10 = cVar2;
          if (sVar9 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_0012a3c0;
          }
          if (sVar9 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_0012a3c0;
          }
          if (sVar9 < 10000) goto LAB_0012a3c0;
          bVar1 = 99999 < sVar9;
          sVar9 = sVar9 / 10000;
          cVar2 = cVar10 + '\x04';
        } while (bVar1);
        cVar10 = cVar10 + '\x01';
      }
LAB_0012a3c0:
      local_130 = &local_120;
      ::std::__cxx11::string::_M_construct((ulong)&local_130,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_130->_M_local_buf,local_128,min_option)
      ;
      plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x145d5b);
      local_110 = &local_100;
      plVar8 = plVar4 + 2;
      if ((long *)*plVar4 == plVar8) {
        local_100 = *plVar8;
        lStack_f8 = plVar4[3];
      }
      else {
        local_100 = *plVar8;
        local_110 = (long *)*plVar4;
      }
      local_108 = plVar4[1];
      *plVar4 = (long)plVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_110);
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar7) {
        local_1a0 = *puVar7;
        lStack_198 = plVar4[3];
        local_1b0 = &local_1a0;
      }
      else {
        local_1a0 = *puVar7;
        local_1b0 = (ulong *)*plVar4;
      }
      local_1a8 = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      cVar10 = '\x01';
      if (9 < used) {
        sVar9 = used;
        cVar2 = '\x04';
        do {
          cVar10 = cVar2;
          if (sVar9 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_0012a512;
          }
          if (sVar9 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_0012a512;
          }
          if (sVar9 < 10000) goto LAB_0012a512;
          bVar1 = 99999 < sVar9;
          sVar9 = sVar9 / 10000;
          cVar2 = cVar10 + '\x04';
        } while (bVar1);
        cVar10 = cVar10 + '\x01';
      }
LAB_0012a512:
      local_190 = local_180;
      ::std::__cxx11::string::_M_construct((ulong)&local_190,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_190,local_188,used);
      uVar3 = CONCAT44(uStack_184,local_188) + local_1a8;
      uVar11 = 0xf;
      if (local_1b0 != &local_1a0) {
        uVar11 = local_1a0;
      }
      if (uVar11 < uVar3) {
        uVar11 = 0xf;
        if (local_190 != local_180) {
          uVar11 = local_180[0];
        }
        if (uVar11 < uVar3) goto LAB_0012a57c;
        puVar5 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_1b0);
      }
      else {
LAB_0012a57c:
        puVar5 = (undefined8 *)
                 ::std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_190);
      }
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      psVar6 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_170.field_2._M_allocated_capacity = *psVar6;
        local_170.field_2._8_8_ = puVar5[3];
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar6;
        local_170._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_170._M_string_length = puVar5[1];
      *puVar5 = psVar6;
      puVar5[1] = 0;
      *(undefined1 *)psVar6 = 0;
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_170);
      local_150 = &local_140;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar7) {
        local_140 = *puVar7;
        lStack_138 = plVar4[3];
      }
      else {
        local_140 = *puVar7;
        local_150 = (ulong *)*plVar4;
      }
      local_148 = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::_M_append
                         ((char *)&local_150,(ulong)(option_list->_M_dataplus)._M_p);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      psVar6 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_1d0.field_2._M_allocated_capacity = *psVar6;
        local_1d0.field_2._8_8_ = puVar5[3];
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *psVar6;
        local_1d0._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_1d0._M_string_length = puVar5[1];
      *puVar5 = psVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_b0.field_2._M_allocated_capacity = *psVar6;
        local_b0.field_2._8_8_ = plVar4[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar6;
        local_b0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_b0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      RequiredError(__return_storage_ptr__,&local_b0,RequiredError);
      uVar12 = local_b0.field_2._M_allocated_capacity;
      _Var13._M_p = local_b0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
LAB_0012aa99:
        operator_delete(_Var13._M_p,uVar12 + 1);
      }
    }
    else {
      if (max_option == 1) {
        ::std::operator+(&local_1d0,"Requires at most 1 options be given from [",option_list);
        plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_d0.field_2._M_allocated_capacity = *psVar6;
          local_d0.field_2._8_8_ = plVar4[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar6;
          local_d0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_d0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        RequiredError(__return_storage_ptr__,&local_d0,RequiredError);
        uVar12 = local_d0.field_2._M_allocated_capacity;
        _Var13._M_p = local_d0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_00129f56;
        goto LAB_00129f5e;
      }
      cVar10 = '\x01';
      if (9 < max_option) {
        sVar9 = max_option;
        cVar2 = '\x04';
        do {
          cVar10 = cVar2;
          if (sVar9 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_0012a735;
          }
          if (sVar9 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_0012a735;
          }
          if (sVar9 < 10000) goto LAB_0012a735;
          bVar1 = 99999 < sVar9;
          sVar9 = sVar9 / 10000;
          cVar2 = cVar10 + '\x04';
        } while (bVar1);
        cVar10 = cVar10 + '\x01';
      }
LAB_0012a735:
      local_130 = &local_120;
      ::std::__cxx11::string::_M_construct((ulong)&local_130,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_long>(local_130->_M_local_buf,local_128,max_option)
      ;
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,0x145e20);
      local_110 = &local_100;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_100 = *plVar4;
        lStack_f8 = puVar5[3];
      }
      else {
        local_100 = *plVar4;
        local_110 = (long *)*puVar5;
      }
      local_108 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_110);
      puVar7 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar7) {
        local_1a0 = *puVar7;
        lStack_198 = puVar5[3];
        local_1b0 = &local_1a0;
      }
      else {
        local_1a0 = *puVar7;
        local_1b0 = (ulong *)*puVar5;
      }
      local_1a8 = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      cVar10 = '\x01';
      if (9 < used) {
        sVar9 = used;
        cVar2 = '\x04';
        do {
          cVar10 = cVar2;
          if (sVar9 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_0012a886;
          }
          if (sVar9 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_0012a886;
          }
          if (sVar9 < 10000) goto LAB_0012a886;
          bVar1 = 99999 < sVar9;
          sVar9 = sVar9 / 10000;
          cVar2 = cVar10 + '\x04';
        } while (bVar1);
        cVar10 = cVar10 + '\x01';
      }
LAB_0012a886:
      local_190 = local_180;
      ::std::__cxx11::string::_M_construct((ulong)&local_190,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_190,local_188,used);
      uVar3 = CONCAT44(uStack_184,local_188) + local_1a8;
      uVar11 = 0xf;
      if (local_1b0 != &local_1a0) {
        uVar11 = local_1a0;
      }
      if (uVar11 < uVar3) {
        uVar11 = 0xf;
        if (local_190 != local_180) {
          uVar11 = local_180[0];
        }
        if (uVar11 < uVar3) goto LAB_0012a8f0;
        puVar5 = (undefined8 *)
                 ::std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,(ulong)local_1b0);
      }
      else {
LAB_0012a8f0:
        puVar5 = (undefined8 *)
                 ::std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_190);
      }
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      psVar6 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_170.field_2._M_allocated_capacity = *psVar6;
        local_170.field_2._8_8_ = puVar5[3];
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar6;
        local_170._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_170._M_string_length = puVar5[1];
      *puVar5 = psVar6;
      puVar5[1] = 0;
      *(undefined1 *)psVar6 = 0;
      puVar5 = (undefined8 *)::std::__cxx11::string::append((char *)&local_170);
      local_150 = &local_140;
      puVar7 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar7) {
        local_140 = *puVar7;
        lStack_138 = puVar5[3];
      }
      else {
        local_140 = *puVar7;
        local_150 = (ulong *)*puVar5;
      }
      local_148 = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)
               ::std::__cxx11::string::_M_append
                         ((char *)&local_150,(ulong)(option_list->_M_dataplus)._M_p);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      psVar6 = puVar5 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_1d0.field_2._M_allocated_capacity = *psVar6;
        local_1d0.field_2._8_8_ = puVar5[3];
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *psVar6;
        local_1d0._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_1d0._M_string_length = puVar5[1];
      *puVar5 = psVar6;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_f0.field_2._M_allocated_capacity = *psVar6;
        local_f0.field_2._8_8_ = plVar4[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar6;
        local_f0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_f0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      RequiredError(__return_storage_ptr__,&local_f0,RequiredError);
      uVar12 = local_f0.field_2._M_allocated_capacity;
      _Var13._M_p = local_f0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_0012aa99;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
    if (local_190 != local_180) {
      operator_delete(local_190,local_180[0] + 1);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    _Var13._M_p = (pointer)local_130;
    if (local_130 == &local_120) {
      return __return_storage_ptr__;
    }
    goto LAB_0012ab5d;
  }
  ::std::operator+(&local_170,"Exactly 1 option from [",option_list);
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_170);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_140 = *puVar7;
    lStack_138 = plVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar7;
    local_150 = (ulong *)*plVar4;
  }
  local_148 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  cVar10 = '\x01';
  if (9 < used) {
    sVar9 = used;
    cVar2 = '\x04';
    do {
      cVar10 = cVar2;
      if (sVar9 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_0012a12e;
      }
      if (sVar9 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_0012a12e;
      }
      if (sVar9 < 10000) goto LAB_0012a12e;
      bVar1 = 99999 < sVar9;
      sVar9 = sVar9 / 10000;
      cVar2 = cVar10 + '\x04';
    } while (bVar1);
    cVar10 = cVar10 + '\x01';
  }
LAB_0012a12e:
  local_1b0 = &local_1a0;
  ::std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1b0,(uint)local_1a8,used);
  uVar3 = 0xf;
  if (local_150 != &local_140) {
    uVar3 = local_140;
  }
  if (uVar3 < (ulong)(local_1a8 + local_148)) {
    uVar3 = 0xf;
    if (local_1b0 != &local_1a0) {
      uVar3 = local_1a0;
    }
    if (uVar3 < (ulong)(local_1a8 + local_148)) goto LAB_0012a19d;
    puVar5 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0012a19d:
    puVar5 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_1b0);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  psVar6 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_1d0.field_2._M_allocated_capacity = *psVar6;
    local_1d0.field_2._8_8_ = puVar5[3];
  }
  else {
    local_1d0.field_2._M_allocated_capacity = *psVar6;
    local_1d0._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_1d0._M_string_length = puVar5[1];
  *puVar5 = psVar6;
  puVar5[1] = 0;
  *(undefined1 *)psVar6 = 0;
  plVar4 = (long *)::std::__cxx11::string::append((char *)&local_1d0);
  psVar6 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70.field_2._8_8_ = plVar4[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar6;
    local_70._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_70._M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  RequiredError(__return_storage_ptr__,&local_70,RequiredError);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  local_120._M_allocated_capacity = local_170.field_2._M_allocated_capacity;
  _Var13._M_p = local_170._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p == &local_170.field_2) {
    return __return_storage_ptr__;
  }
LAB_0012ab5d:
  operator_delete(_Var13._M_p,local_120._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

static RequiredError
    Option(std::size_t min_option, std::size_t max_option, std::size_t used, const std::string &option_list) {
        if((min_option == 1) && (max_option == 1) && (used == 0))
            return RequiredError("Exactly 1 option from [" + option_list + "]");
        if((min_option == 1) && (max_option == 1) && (used > 1)) {
            return RequiredError("Exactly 1 option from [" + option_list + "] is required and " + std::to_string(used) +
                                     " were given",
                                 ExitCodes::RequiredError);
        }
        if((min_option == 1) && (used == 0))
            return RequiredError("At least 1 option from [" + option_list + "]");
        if(used < min_option) {
            return RequiredError("Requires at least " + std::to_string(min_option) + " options used and only " +
                                     std::to_string(used) + "were given from [" + option_list + "]",
                                 ExitCodes::RequiredError);
        }
        if(max_option == 1)
            return RequiredError("Requires at most 1 options be given from [" + option_list + "]",
                                 ExitCodes::RequiredError);

        return RequiredError("Requires at most " + std::to_string(max_option) + " options be used and " +
                                 std::to_string(used) + "were given from [" + option_list + "]",
                             ExitCodes::RequiredError);
    }